

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

void clean_other_for_line(Am_Object *o2,Am_Object *line,Am_Slot_Key slot)

{
  byte bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  ushort uVar4;
  undefined1 local_30 [8];
  Am_Value v;
  Am_Slot_Key slot_local;
  Am_Object *line_local;
  Am_Object *o2_local;
  
  v.value.long_value._6_2_ = slot;
  Am_Value::Am_Value((Am_Value *)local_30);
  pAVar2 = Am_Object::Peek(o2,INPUT_1,0);
  Am_Value::operator=((Am_Value *)local_30,(Am_Value *)pAVar2);
  pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(line);
  bVar1 = Am_Value::operator==((Am_Value *)local_30,pAVar3);
  uVar4 = (ushort)line;
  if ((bVar1 & 1) == 0) {
    pAVar2 = Am_Object::Peek(o2,INPUT_2,0);
    Am_Value::operator=((Am_Value *)local_30,(Am_Value *)pAVar2);
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(line);
    bVar1 = Am_Value::operator==((Am_Value *)local_30,pAVar3);
    if ((bVar1 & 1) == 0) {
      line_for_list(o2,line,true);
      Am_Object::Set(uVar4,(uint)(ushort)v.value.long_value._6_2_,(ulong)OUTPUT_1);
    }
    else {
      Am_Object::Set((ushort)o2,(uint)INPUT_2,0);
      Am_Object::Set(uVar4,(uint)(ushort)v.value.long_value._6_2_,(ulong)INPUT_2);
    }
  }
  else {
    Am_Object::Set((ushort)o2,(uint)INPUT_1,0);
    Am_Object::Set(uVar4,(uint)(ushort)v.value.long_value._6_2_,(ulong)INPUT_1);
  }
  Am_Value::~Am_Value((Am_Value *)local_30);
  return;
}

Assistant:

void clean_other_for_line(Am_Object &o2, Am_Object &line, Am_Slot_Key slot) {
  Am_Value v;
  v = o2.Peek(INPUT_1);
  if (v == line) {
    o2.Set(INPUT_1, 0);
    line.Set(slot, INPUT_1, Am_OK_IF_NOT_THERE);
  }
  else {
    v = o2.Peek(INPUT_2);
    if (v == line) {
      o2.Set(INPUT_2, 0);
      line.Set(slot, INPUT_2, Am_OK_IF_NOT_THERE);
    }
    else {
      line_for_list(o2, line, true);
      line.Set(slot, OUTPUT_1, Am_OK_IF_NOT_THERE);
    }
  }
}